

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O2

QStringList * QUrl::idnWhitelist(void)

{
  int iVar1;
  Char *s;
  QArrayDataPointer<QString> *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView local_60;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (user_idn_whitelist == (QStringList *)0x0) {
    if (idnWhitelist()::list == '\0') {
      iVar1 = __cxa_guard_acquire(&idnWhitelist()::list);
      if (iVar1 != 0) {
        idnWhitelist::list.d.d = (Data *)0x0;
        idnWhitelist::list.d.ptr = (QString *)0x0;
        idnWhitelist::list.d.size = 0;
        QList<QString>::reserve(&idnWhitelist::list,0x3d);
        for (iVar1 = 0; iVar1 != 0x3d; iVar1 = iVar1 + 1) {
          s = QOffsetStringArray<std::array<char,_364UL>,_std::array<unsigned_short,_62UL>_>::at
                        (&idn_whitelist,iVar1);
          QLatin1String::QLatin1String(&local_60,s);
          QString::QString((QString *)&local_50,local_60);
          QList<QString>::emplaceBack<QString>(&idnWhitelist::list,(QString *)&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        }
        __cxa_atexit(QList<QString>::~QList,&idnWhitelist::list,&__dso_handle);
        __cxa_guard_release(&idnWhitelist()::list);
      }
    }
    QArrayDataPointer<QString>::QArrayDataPointer(in_RDI,&idnWhitelist::list.d);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00246baf;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00246baf:
      __stack_chk_fail();
    }
    QArrayDataPointer<QString>::QArrayDataPointer(in_RDI,&user_idn_whitelist->d);
  }
  return (QStringList *)in_RDI;
}

Assistant:

QStringList QUrl::idnWhitelist()
{
    if (user_idn_whitelist)
        return *user_idn_whitelist;
    static const QStringList list = [] {
        QStringList list;
        list.reserve(idn_whitelist.count());
        int i = 0;
        while (i < idn_whitelist.count()) {
            list << QLatin1StringView(idn_whitelist.at(i));
            ++i;
        }
        return list;
    }();
    return list;
}